

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O2

bool treatAsAbsolute(QString *path)

{
  bool bVar1;
  bool bVar2;
  bool bVar3;
  long in_FS_OFFSET;
  QFileInfo QStack_68;
  QFileSystemEntry local_60;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::contains(path,(QChar)0x3a,CaseSensitive);
  if (bVar1) {
    QFileInfo::QFileInfo(&QStack_68,path);
    bVar2 = QFileInfo::isAbsolute(&QStack_68);
    bVar3 = true;
    if (!bVar2) goto LAB_0010a71f;
  }
  else {
LAB_0010a71f:
    QFileSystemEntry::QFileSystemEntry(&local_60,path);
    bVar3 = QFileSystemEntry::isAbsolute(&local_60);
    QFileSystemEntry::~QFileSystemEntry(&local_60);
    if (!bVar1) goto LAB_0010a74d;
  }
  QFileInfo::~QFileInfo(&QStack_68);
LAB_0010a74d:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar3;
  }
  __stack_chk_fail();
}

Assistant:

static bool treatAsAbsolute(const QString &path)
{
    // ### Qt 6: be consistent about absolute paths

    // QFileInfo will use the right FS-engine for virtual file-systems
    // (e.g. resource paths).  Unfortunately, for real file-systems, it relies
    // on QFileSystemEntry's isRelative(), which is flawed on MS-Win, ignoring
    // its (correct) isAbsolute().  So only use that isAbsolute() unless there's
    // a colon in the path.
    // FIXME: relies on virtual file-systems having colons in their prefixes.
    // The case of an MS-absolute C:/... path happens to work either way.
    return (path.contains(u':') && QFileInfo(path).isAbsolute())
        || QFileSystemEntry(path).isAbsolute();
}